

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

Abc_Obj_t * Abc_SclPerformBufferingOne(Abc_Obj_t *pObj,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  Abc_Obj_t *pFaninNew;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  iVar1 = (pObj->vFanouts).nSize;
  if (iVar1 <= Degree) {
    __assert_fail("Abc_ObjFanoutNum(pObj) > Degree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclBuffer.c"
                  ,0x172,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
  }
  uVar9 = (ulong)(uint)Degree;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar4 << 3);
  }
  vNodes->pArray = ppvVar2;
  Abc_NodeCollectFanouts(pObj,vNodes);
  if (1 < (long)vNodes->nSize) {
    qsort(vNodes->pArray,(long)vNodes->nSize,8,Abc_NodeCompareLevels);
  }
  if (fUseInvs == 0) {
    pFaninNew = Abc_NtkCreateNodeBuf(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  else {
    pFaninNew = Abc_NtkCreateNodeInv(pObj->pNtk,(Abc_Obj_t *)0x0);
  }
  uVar5 = vNodes->nSize;
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 < Degree * 2) {
    uVar8 = ~Degree + uVar5;
    if (((((int)uVar8 < 0) || ((int)uVar5 <= (int)uVar8)) || (Degree < 1)) || ((int)uVar5 < Degree))
    {
LAB_003c500f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if ((int)uVar5 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
    }
    ppvVar2 = vNodes->pArray;
    uVar12 = *(uint *)((long)ppvVar2[(ulong)(uint)Degree - 1] + 0x14) >> 0xc;
    uVar6 = *(uint *)((long)ppvVar2[uVar13 - 1] + 0x14) >> 0xc;
    uVar10 = Degree;
    if ((uVar12 == uVar6) && (*(uint *)((long)ppvVar2[uVar8] + 0x14) >> 0xc < uVar12)) {
      if (*(uint *)((long)*ppvVar2 + 0x14) >> 0xc == uVar6) {
        bVar14 = true;
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          if (uVar13 - 1 == uVar9) goto LAB_003c502e;
          lVar3 = uVar9 + 1;
          uVar9 = uVar9 + 1;
        } while (*(uint *)((long)ppvVar2[lVar3] + 0x14) >> 0xc != uVar6);
        bVar14 = uVar9 < uVar13;
      }
      if (!bVar14) {
LAB_003c502e:
        __assert_fail("i < Vec_PtrSize(vFanouts)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclBuffer.c"
                      ,0x189,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
      }
      if (1 < uVar9) {
        uVar10 = (uint)uVar9;
      }
    }
    uVar8 = (uVar5 & 1) + (uVar5 >> 1);
    if ((int)uVar10 <= (int)(uVar5 - uVar10)) {
      uVar8 = uVar10;
    }
    if (uVar10 != Degree) {
      uVar8 = uVar10;
    }
    uVar9 = (ulong)uVar8;
    if (Degree < (int)uVar8) {
      __assert_fail("Degree <= Degree0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclBuffer.c"
                    ,400,"Abc_Obj_t *Abc_SclPerformBufferingOne(Abc_Obj_t *, int, int, int)");
    }
  }
  if (0 < (int)uVar9) {
    uVar13 = 0;
    do {
      if ((long)vNodes->nSize <= (long)uVar13) goto LAB_003c500f;
      Abc_ObjPatchFanin((Abc_Obj_t *)vNodes->pArray[uVar13],pObj,pFaninNew);
      uVar13 = uVar13 + 1;
    } while (uVar9 != uVar13);
  }
  if (fVerbose != 0) {
    printf("%5d : ",(ulong)(uint)pObj->Id);
    if (0 < vNodes->nSize) {
      uVar13 = 0;
      do {
        pcVar7 = "";
        if ((int)uVar9 - 1 == uVar13) {
          pcVar7 = "  ";
        }
        printf("%d%s ",(ulong)(*(uint *)((long)vNodes->pArray[uVar13] + 0x14) >> 0xc),pcVar7);
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)vNodes->nSize);
    }
    putchar(10);
  }
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  Abc_ObjAddFanin(pFaninNew,pObj);
  lVar3 = (long)(pFaninNew->vFanouts).nSize;
  if (lVar3 < 1) {
    uVar5 = 0x1000;
  }
  else {
    lVar11 = 0;
    uVar5 = 0;
    do {
      uVar8 = *(uint *)((long)pFaninNew->pNtk->vObjs->pArray[(pFaninNew->vFanouts).pArray[lVar11]] +
                       0x14) >> 0xc;
      if (uVar8 < uVar5) {
        uVar8 = uVar5;
      }
      uVar5 = uVar8;
      lVar11 = lVar11 + 1;
    } while (lVar3 != lVar11);
    uVar5 = uVar5 * 0x1000 + 0x1000;
  }
  *(uint *)&pFaninNew->field_0x14 = *(uint *)&pFaninNew->field_0x14 & 0xfff | uVar5;
  if (fUseInvs != 0) {
    Abc_NodeInvUpdateFanPolarity(pFaninNew);
  }
  return pFaninNew;
}

Assistant:

Abc_Obj_t * Abc_SclPerformBufferingOne( Abc_Obj_t * pObj, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Ptr_t * vFanouts;
    Abc_Obj_t * pBuffer, * pFanout;
    int i, Degree0 = Degree;
    assert( Abc_ObjFanoutNum(pObj) > Degree );
    // collect fanouts and sort by reverse level
    vFanouts = Vec_PtrAlloc( Abc_ObjFanoutNum(pObj) );
    Abc_NodeCollectFanouts( pObj, vFanouts );
    Vec_PtrSort( vFanouts, (int (*)(void))Abc_NodeCompareLevels );
    // select the first Degree fanouts
    if ( fUseInvs )
        pBuffer = Abc_NtkCreateNodeInv( pObj->pNtk, NULL );
    else
        pBuffer = Abc_NtkCreateNodeBuf( pObj->pNtk, NULL );
    // check if it is possible to not increase level
    if ( Vec_PtrSize(vFanouts) < 2 * Degree )
    {
        Abc_Obj_t * pFanPrev = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Vec_PtrSize(vFanouts)-1-Degree);
        Abc_Obj_t * pFanThis = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, Degree-1);
        Abc_Obj_t * pFanLast = (Abc_Obj_t *)Vec_PtrEntryLast(vFanouts);
        if ( Abc_ObjLevel(pFanThis) == Abc_ObjLevel(pFanLast) &&
             Abc_ObjLevel(pFanPrev) <  Abc_ObjLevel(pFanThis) )
        {
            // find the first one whose level is the same as last
            Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
                if ( Abc_ObjLevel(pFanout) == Abc_ObjLevel(pFanLast) )
                    break;
            assert( i < Vec_PtrSize(vFanouts) );
            if ( i > 1 )
                Degree = i;
        }
        // make the last two more well-balanced
        if ( Degree == Degree0 && Degree > Vec_PtrSize(vFanouts) - Degree )
            Degree = Vec_PtrSize(vFanouts)/2 + (Vec_PtrSize(vFanouts) & 1);
        assert( Degree <= Degree0 );
    }
    // select fanouts
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vFanouts, pFanout, i, Degree )
        Abc_ObjPatchFanin( pFanout, pObj, pBuffer );
    if ( fVerbose )
    {
        printf( "%5d : ", Abc_ObjId(pObj) );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
            printf( "%d%s ", Abc_ObjLevel(pFanout), i == Degree-1 ? "  " : "" );
        printf( "\n" );
    }
    Vec_PtrFree( vFanouts );
    Abc_ObjAddFanin( pBuffer, pObj );
    pBuffer->Level = Abc_SclComputeReverseLevel( pBuffer );
    if ( fUseInvs )
        Abc_NodeInvUpdateFanPolarity( pBuffer );
    return pBuffer;
}